

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

void sysbvm_type_setInstanceSizeAndAlignment
               (sysbvm_context_t *context,sysbvm_tuple_t type,size_t instanceSize,
               size_t instanceAlignment)

{
  sysbvm_tuple_t sVar1;
  
  if (((type & 0xf) == 0 && type != 0) && ((*(byte *)(type + 8) & 0x80) == 0)) {
    if (instanceSize + 0x800000000000000 >> 0x3c == 0) {
      sVar1 = instanceSize << 4 | 0xb;
    }
    else {
      sVar1 = sysbvm_tuple_uint64_encodeBig(context,instanceSize);
    }
    *(sysbvm_tuple_t *)(type + 0x60) = sVar1;
    if (instanceAlignment + 0x800000000000000 < 0x1000000000000000) {
      sVar1 = instanceAlignment << 4 | 0xb;
    }
    else {
      sVar1 = sysbvm_tuple_uint64_encodeBig(context,instanceAlignment);
    }
    *(sysbvm_tuple_t *)(type + 0x68) = sVar1;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_type_setInstanceSizeAndAlignment(sysbvm_context_t *context, sysbvm_tuple_t type, size_t instanceSize, size_t instanceAlignment)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return;
    if(sysbvm_tuple_isDummyValue(type)) return;

    sysbvm_type_tuple_t *typeObject = (sysbvm_type_tuple_t*)type;
    typeObject->instanceSize = sysbvm_tuple_size_encode(context, instanceSize);
    typeObject->instanceAlignment = sysbvm_tuple_size_encode(context, instanceAlignment);
}